

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall ObjectModelBuilder::build(ObjectModelBuilder *this,value *value)

{
  bool bVar1;
  bool bVar2;
  object *poVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  string local_88;
  undefined1 local_68 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  i;
  
  i.second.u_._4_4_ = value->type_;
  if (i.second.u_._4_4_ == 5) {
    poVar3 = picojson::value::
             get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                       (value);
    for (p_Var4 = (poVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(poVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
              *)local_68,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
              *)(p_Var4 + 1));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"class-declarations");
      if (bVar1) {
LAB_001108d2:
        bVar1 = buildClasses(this,(value *)((long)&i.first.field_2 + 8),bVar1);
        if (!bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"error: failed to build \'");
          poVar5 = std::operator<<(poVar5,(string *)local_68);
          poVar5 = std::operator<<(poVar5,"\', ");
          picojson::value::to_str_abi_cxx11_(&local_88,(value *)((long)&i.first.field_2 + 8));
          poVar5 = std::operator<<(poVar5,(string *)&local_88);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_88);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                   *)local_68);
          break;
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"classes");
        if (bVar2) goto LAB_001108d2;
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
               *)local_68);
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"error: toplevel json element is not a value");
    picojson::value::to_str_abi_cxx11_((string *)local_68,value);
    poVar5 = std::operator<<(poVar5,(string *)local_68);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)local_68);
  }
  return i.second.u_._4_4_ == 5;
}

Assistant:

bool ObjectModelBuilder::build(const picojson::value &value)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: toplevel json element is not a value" << value.to_str() << std::endl;
        return false;
    }

    bool ok = true;
    const picojson::object &object = value.get<picojson::object>();
    for (auto i : object) {
        if (i.first == "class-declarations") {
            ok = buildClasses(i.second, true);
        } else if (i.first == "classes") {
            ok = buildClasses(i.second, false);
        }

        if (!ok) {
            std::cerr << "error: failed to build '" << i.first << "', " << i.second.to_str() << std::endl;
            break;
        }
    }

    return true;
}